

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

string * __thiscall
KMeans::genClusterInitialization(string *__return_storage_ptr__,KMeans *this,string *gridName)

{
  ulong uVar1;
  ostream *poVar2;
  istream *piVar3;
  ulong uVar4;
  ulong uVar5;
  string *this_00;
  ulong __val;
  long lVar6;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0;
  string local_13c0;
  string local_13a0;
  string local_1380;
  string local_1360;
  string local_1340;
  string local_1320;
  string local_1300;
  string local_12e0;
  string local_12c0;
  string local_12a0;
  string local_1280;
  string local_1260;
  string local_1240;
  string local_1220;
  string local_1200;
  string local_11e0;
  string local_11c0;
  string local_11a0;
  string local_1180;
  string local_1160;
  string local_1140;
  string local_1120;
  string local_1100;
  string local_10e0;
  string local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  stringstream ssLine;
  ifstream input;
  byte abStack_218 [488];
  
  initList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  initList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_FILES_abi_cxx11_,"/cluster_init.conf");
  std::ifstream::ifstream(&input,(string *)&ssLine,_S_in);
  std::__cxx11::string::~string((string *)&ssLine);
  poVar2 = std::operator<<((ostream *)&std::cout,"INFO: Looking for cluster initialization file: ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_FILES_abi_cxx11_,"/cluster_init.conf");
  poVar2 = std::operator<<(poVar2,(string *)&ssLine);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&ssLine);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (*line._M_dataplus._M_p != '#') {
        std::operator+(&local_14e0,&line,"\n");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&initList,
                   &local_14e0);
        std::__cxx11::string::~string((string *)&local_14e0);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
    std::__cxx11::string::~string((string *)&line);
    Application::offset_abi_cxx11_((string *)&ssLine,&this->super_Application,2);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   "// Initialize the means\n");
    std::__cxx11::string::~string((string *)&ssLine);
    lVar6 = 0;
    __val = 0;
    while( true ) {
      uVar4 = (long)initList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)initList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar1 = this->_k;
      uVar5 = uVar4;
      if (uVar1 < uVar4) {
        uVar5 = uVar1;
      }
      if (uVar5 <= __val) break;
      Application::offset_abi_cxx11_(&local_14a0,&this->super_Application,2);
      std::operator+(&local_1500,&local_14a0,"means[");
      std::__cxx11::to_string(&local_14c0,__val);
      std::operator+(&local_14e0,&local_1500,&local_14c0);
      std::operator+(&line,&local_14e0,"] = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                     &line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((initList.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar6));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ssLine);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_14e0);
      std::__cxx11::string::~string((string *)&local_14c0);
      std::__cxx11::string::~string((string *)&local_1500);
      std::__cxx11::string::~string((string *)&local_14a0);
      __val = __val + 1;
      lVar6 = lVar6 + 0x20;
    }
    if (uVar1 <= uVar4) goto LAB_0018967e;
    Application::offset_abi_cxx11_(&local_1440,&this->super_Application,2);
    std::operator+(&local_1420,&local_1440,"for (size_t cluster = ");
    std::__cxx11::to_string
              (&local_1460,
               (long)initList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)initList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+(&local_1400,&local_1420,&local_1460);
    std::operator+(&local_13e0,&local_1400,"; cluster < k; ++cluster)\n");
    Application::offset_abi_cxx11_(&local_1480,&this->super_Application,3);
    std::operator+(&local_14c0,&local_13e0,&local_1480);
    std::operator+(&local_14a0,&local_14c0,"means[cluster] += ");
    std::operator+(&local_1500,&local_14a0,gridName);
    std::operator+(&local_14e0,&local_1500,"[rand() % ");
    std::operator+(&line,&local_14e0,gridName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   &line,".size()];\n\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&ssLine);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::__cxx11::string::~string((string *)&local_1500);
    std::__cxx11::string::~string((string *)&local_14a0);
    std::__cxx11::string::~string((string *)&local_14c0);
    std::__cxx11::string::~string((string *)&local_1480);
    std::__cxx11::string::~string((string *)&local_13e0);
    std::__cxx11::string::~string((string *)&local_1400);
    std::__cxx11::string::~string((string *)&local_1460);
    std::__cxx11::string::~string((string *)&local_1420);
    this_00 = &local_1440;
  }
  else {
    std::operator<<((ostream *)&std::cout,"INFO: No cluster initialization file provided. \n");
    std::operator<<((ostream *)&std::cout,"INFO: We will use Kmeans++ Initialization instead. \n");
    Application::offset_abi_cxx11_(&local_e60,&this->super_Application,2);
    std::operator+(&local_e40,&local_e60,"// Initialize the means\n\n");
    Application::offset_abi_cxx11_(&local_e80,&this->super_Application,2);
    std::operator+(&local_e20,&local_e40,&local_e80);
    std::operator+(&local_e00,&local_e20,"std::srand (time(NULL));\n\n");
    Application::offset_abi_cxx11_(&local_ea0,&this->super_Application,2);
    std::operator+(&local_de0,&local_e00,&local_ea0);
    std::operator+(&local_dc0,&local_de0,
                   "double randomVal = (double)(rand() % (size_t)size_of_query_result);\n");
    Application::offset_abi_cxx11_(&local_ec0,&this->super_Application,2);
    std::operator+(&local_da0,&local_dc0,&local_ec0);
    std::operator+(&local_d80,&local_da0,"double count = 0.0;\n");
    Application::offset_abi_cxx11_(&local_ee0,&this->super_Application,2);
    std::operator+(&local_d60,&local_d80,&local_ee0);
    std::operator+(&local_d40,&local_d60,"size_t pos = 0;\n");
    Application::offset_abi_cxx11_(&local_f00,&this->super_Application,2);
    std::operator+(&local_d20,&local_d40,&local_f00);
    std::operator+(&local_d00,&local_d20,"while (randomVal < count)\n");
    Application::offset_abi_cxx11_(&local_f20,&this->super_Application,2);
    std::operator+(&local_ce0,&local_d00,&local_f20);
    std::operator+(&local_cc0,&local_ce0,"{\n");
    Application::offset_abi_cxx11_(&local_f40,&this->super_Application,3);
    std::operator+(&local_ca0,&local_cc0,&local_f40);
    std::operator+(&local_c80,&local_ca0,"count += ");
    std::operator+(&local_c60,&local_c80,gridName);
    std::operator+(&local_c40,&local_c60,"[pos].aggregates[0];\n");
    Application::offset_abi_cxx11_(&local_f60,&this->super_Application,3);
    std::operator+(&local_c20,&local_c40,&local_f60);
    std::operator+(&local_c00,&local_c20,"++pos;\n");
    Application::offset_abi_cxx11_(&local_f80,&this->super_Application,2);
    std::operator+(&local_be0,&local_c00,&local_f80);
    std::operator+(&local_bc0,&local_be0,"}\n");
    Application::offset_abi_cxx11_(&local_fa0,&this->super_Application,2);
    std::operator+(&local_ba0,&local_bc0,&local_fa0);
    std::operator+(&local_b80,&local_ba0,"means[0] = ");
    std::operator+(&local_b60,&local_b80,gridName);
    std::operator+(&local_b40,&local_b60,"[pos];\n");
    Application::offset_abi_cxx11_(&local_fc0,&this->super_Application,2);
    std::operator+(&local_b20,&local_b40,&local_fc0);
    std::operator+(&local_b00,&local_b20,"std::vector<double> distribution(grid_size,0.0);\n");
    Application::offset_abi_cxx11_(&local_fe0,&this->super_Application,2);
    std::operator+(&local_ae0,&local_b00,&local_fe0);
    std::operator+(&local_ac0,&local_ae0,"for (size_t i = 1; i < k; ++i)\n");
    Application::offset_abi_cxx11_(&local_1000,&this->super_Application,2);
    std::operator+(&local_aa0,&local_ac0,&local_1000);
    std::operator+(&local_a80,&local_aa0,"{\n");
    Application::offset_abi_cxx11_(&local_1020,&this->super_Application,3);
    std::operator+(&local_a60,&local_a80,&local_1020);
    std::operator+(&local_a40,&local_a60,"computeMeanDistance(&distance_to_mean[0], &means[0]);\n");
    Application::offset_abi_cxx11_(&local_1040,&this->super_Application,3);
    std::operator+(&local_a20,&local_a40,&local_1040);
    std::operator+(&local_a00,&local_a20,"double dist_sum = 0.0;\n");
    Application::offset_abi_cxx11_(&local_1060,&this->super_Application,3);
    std::operator+(&local_9e0,&local_a00,&local_1060);
    std::operator+(&local_9c0,&local_9e0,
                   "#pragma omp parallel for num_threads(32) private(min_dist,dist) shared(distribution) reduction(+:dist_sum)\n"
                  );
    Application::offset_abi_cxx11_(&local_1080,&this->super_Application,3);
    std::operator+(&local_9a0,&local_9c0,&local_1080);
    std::operator+(&local_980,&local_9a0,"for (size_t tup = 0; tup < grid_size; ++tup)\n");
    Application::offset_abi_cxx11_(&local_10a0,&this->super_Application,3);
    std::operator+(&local_960,&local_980,&local_10a0);
    std::operator+(&local_940,&local_960,"{\n");
    Application::offset_abi_cxx11_(&local_10c0,&this->super_Application,4);
    std::operator+(&local_920,&local_940,&local_10c0);
    std::operator+(&local_900,&local_920,"min_dist = std::numeric_limits<double>::max();\n");
    Application::offset_abi_cxx11_(&local_10e0,&this->super_Application,4);
    std::operator+(&local_8e0,&local_900,&local_10e0);
    std::operator+(&local_8c0,&local_8e0,"for (size_t cluster = 0; cluster < i; ++cluster)\n");
    Application::offset_abi_cxx11_(&local_1100,&this->super_Application,4);
    std::operator+(&local_8a0,&local_8c0,&local_1100);
    std::operator+(&local_880,&local_8a0,"{\n");
    Application::offset_abi_cxx11_(&local_1120,&this->super_Application,5);
    std::operator+(&local_860,&local_880,&local_1120);
    std::operator+(&local_840,&local_860,"distance(dist, ");
    std::operator+(&local_820,&local_840,gridName);
    std::operator+(&local_800,&local_820,"[tup], means[cluster], cluster, &distance_to_mean[0]);\n")
    ;
    Application::offset_abi_cxx11_(&local_1140,&this->super_Application,5);
    std::operator+(&local_7e0,&local_800,&local_1140);
    std::operator+(&local_7c0,&local_7e0,"min_dist = std::min(dist, min_dist);\n");
    Application::offset_abi_cxx11_(&local_1160,&this->super_Application,4);
    std::operator+(&local_7a0,&local_7c0,&local_1160);
    std::operator+(&local_780,&local_7a0,"}\n");
    Application::offset_abi_cxx11_(&local_1180,&this->super_Application,4);
    std::operator+(&local_760,&local_780,&local_1180);
    std::operator+(&local_740,&local_760,"min_dist *= ");
    std::operator+(&local_720,&local_740,gridName);
    std::operator+(&local_700,&local_720,"[tup].aggregates[0];\n");
    Application::offset_abi_cxx11_(&local_11a0,&this->super_Application,4);
    std::operator+(&local_6e0,&local_700,&local_11a0);
    std::operator+(&local_6c0,&local_6e0,"distribution[tup] = min_dist;\n");
    Application::offset_abi_cxx11_(&local_11c0,&this->super_Application,4);
    std::operator+(&local_6a0,&local_6c0,&local_11c0);
    std::operator+(&local_680,&local_6a0,"dist_sum += min_dist;\n");
    Application::offset_abi_cxx11_(&local_11e0,&this->super_Application,3);
    std::operator+(&local_660,&local_680,&local_11e0);
    std::operator+(&local_640,&local_660,"}\n");
    Application::offset_abi_cxx11_(&local_1200,&this->super_Application,3);
    std::operator+(&local_620,&local_640,&local_1200);
    std::operator+(&local_600,&local_620,"distribution[0] /= dist_sum;\n");
    Application::offset_abi_cxx11_(&local_1220,&this->super_Application,3);
    std::operator+(&local_5e0,&local_600,&local_1220);
    std::operator+(&local_5c0,&local_5e0,"for (size_t tup = 1; tup < grid_size; ++tup)\n");
    Application::offset_abi_cxx11_(&local_1240,&this->super_Application,3);
    std::operator+(&local_5a0,&local_5c0,&local_1240);
    std::operator+(&local_580,&local_5a0,"{\n");
    Application::offset_abi_cxx11_(&local_1260,&this->super_Application,4);
    std::operator+(&local_560,&local_580,&local_1260);
    std::operator+(&local_540,&local_560,"distribution[tup] /= dist_sum;\n");
    Application::offset_abi_cxx11_(&local_1280,&this->super_Application,4);
    std::operator+(&local_520,&local_540,&local_1280);
    std::operator+(&local_500,&local_520,"distribution[tup] += distribution[tup-1];\n");
    Application::offset_abi_cxx11_(&local_12a0,&this->super_Application,3);
    std::operator+(&local_4e0,&local_500,&local_12a0);
    std::operator+(&local_4c0,&local_4e0,"}\n\n");
    Application::offset_abi_cxx11_(&local_12c0,&this->super_Application,3);
    std::operator+(&local_4a0,&local_4c0,&local_12c0);
    std::operator+(&local_480,&local_4a0,"// Sample a point...\n");
    Application::offset_abi_cxx11_(&local_12e0,&this->super_Application,3);
    std::operator+(&local_460,&local_480,&local_12e0);
    std::operator+(&local_440,&local_460,
                   "const double sampleValue = ((double) rand() / (RAND_MAX));\n");
    Application::offset_abi_cxx11_(&local_1300,&this->super_Application,3);
    std::operator+(&local_420,&local_440,&local_1300);
    std::operator+(&local_400,&local_420,"size_t pos = 0;\n");
    Application::offset_abi_cxx11_(&local_1320,&this->super_Application,3);
    std::operator+(&local_3e0,&local_400,&local_1320);
    std::operator+(&local_1480,&local_3e0,"while (distribution[pos] < sampleValue)\n");
    Application::offset_abi_cxx11_(&local_1340,&this->super_Application,4);
    std::operator+(&local_1460,&local_1480,&local_1340);
    std::operator+(&local_1440,&local_1460,"pos++;\n");
    Application::offset_abi_cxx11_(&local_1360,&this->super_Application,3);
    std::operator+(&local_1420,&local_1440,&local_1360);
    std::operator+(&local_1400,&local_1420,"means[i] = ");
    std::operator+(&local_13e0,&local_1400,gridName);
    std::operator+(&local_14c0,&local_13e0,"[pos];\n");
    Application::offset_abi_cxx11_(&local_1380,&this->super_Application,2);
    std::operator+(&local_14a0,&local_14c0,&local_1380);
    std::operator+(&local_1500,&local_14a0,"}\n");
    Application::offset_abi_cxx11_(&local_13a0,&this->super_Application,2);
    std::operator+(&local_14e0,&local_1500,&local_13a0);
    std::operator+(&line,&local_14e0,
                   "int64_t endInit = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count()-startProcess;\n"
                  );
    Application::offset_abi_cxx11_(&local_13c0,&this->super_Application,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   &line,&local_13c0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   "startProcess = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();\n"
                  );
    std::__cxx11::string::~string((string *)&ssLine);
    std::__cxx11::string::~string((string *)&local_13c0);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::__cxx11::string::~string((string *)&local_13a0);
    std::__cxx11::string::~string((string *)&local_1500);
    std::__cxx11::string::~string((string *)&local_14a0);
    std::__cxx11::string::~string((string *)&local_1380);
    std::__cxx11::string::~string((string *)&local_14c0);
    std::__cxx11::string::~string((string *)&local_13e0);
    std::__cxx11::string::~string((string *)&local_1400);
    std::__cxx11::string::~string((string *)&local_1420);
    std::__cxx11::string::~string((string *)&local_1360);
    std::__cxx11::string::~string((string *)&local_1440);
    std::__cxx11::string::~string((string *)&local_1460);
    std::__cxx11::string::~string((string *)&local_1340);
    std::__cxx11::string::~string((string *)&local_1480);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_1320);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_1300);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_12e0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_12c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_1280);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_1260);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_1240);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_1220);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_1200);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_11e0);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_11c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_11a0);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_1180);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_1160);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_1140);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_1120);
    std::__cxx11::string::~string((string *)&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)&local_1100);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_10e0);
    std::__cxx11::string::~string((string *)&local_900);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)&local_10c0);
    std::__cxx11::string::~string((string *)&local_940);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_10a0);
    std::__cxx11::string::~string((string *)&local_980);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::__cxx11::string::~string((string *)&local_1080);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_1060);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_1040);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::~string((string *)&local_1020);
    std::__cxx11::string::~string((string *)&local_a80);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_1000);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::~string((string *)&local_fe0);
    std::__cxx11::string::~string((string *)&local_b00);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_fc0);
    std::__cxx11::string::~string((string *)&local_b40);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b80);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&local_f80);
    std::__cxx11::string::~string((string *)&local_c00);
    std::__cxx11::string::~string((string *)&local_c20);
    std::__cxx11::string::~string((string *)&local_f60);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::string::~string((string *)&local_c60);
    std::__cxx11::string::~string((string *)&local_c80);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_f40);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::__cxx11::string::~string((string *)&local_ce0);
    std::__cxx11::string::~string((string *)&local_f20);
    std::__cxx11::string::~string((string *)&local_d00);
    std::__cxx11::string::~string((string *)&local_d20);
    std::__cxx11::string::~string((string *)&local_f00);
    std::__cxx11::string::~string((string *)&local_d40);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_ee0);
    std::__cxx11::string::~string((string *)&local_d80);
    std::__cxx11::string::~string((string *)&local_da0);
    std::__cxx11::string::~string((string *)&local_ec0);
    std::__cxx11::string::~string((string *)&local_dc0);
    std::__cxx11::string::~string((string *)&local_de0);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::__cxx11::string::~string((string *)&local_e00);
    std::__cxx11::string::~string((string *)&local_e20);
    std::__cxx11::string::~string((string *)&local_e80);
    std::__cxx11::string::~string((string *)&local_e40);
    this_00 = &local_e60;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0018967e:
  std::ifstream::~ifstream(&input);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&initList);
  return __return_storage_ptr__;
}

Assistant:

std::string KMeans::genClusterInitialization(const std::string& gridName)
{
    std::vector<std::string> initList;

    /* Load the cluster initialization file into an input stream. */
    ifstream input(multifaq::dir::PATH_TO_FILES + "/cluster_init.conf");

    std::cout << "INFO: Looking for cluster initialization file: " << multifaq::dir::PATH_TO_FILES + "/cluster_init.conf" << std::endl;

    if (!input)
    {
        std::cout << "INFO: No cluster initialization file provided. \n";
        std::cout << "INFO: We will use Kmeans++ Initialization instead. \n";
        
        return offset(2)+"// Initialize the means\n\n"+
            offset(2)+"std::srand (time(NULL));\n\n"+
	  offset(2)+"double randomVal = (double)(rand() % (size_t)size_of_query_result);\n"+
	  offset(2)+"double count = 0.0;\n"+
	  offset(2)+"size_t pos = 0;\n"+
	  offset(2)+"while (randomVal < count)\n"+
	  offset(2)+"{\n"+
	  offset(3)+"count += "+gridName+"[pos].aggregates[0];\n"+
	  offset(3)+"++pos;\n"+
	  offset(2)+"}\n"+
	  offset(2)+"means[0] = "+gridName+"[pos];\n"+
            // offset(2)+"means[0] = "+gridName+"[rand() % grid_size];\n\n"+
            offset(2)+"std::vector<double> distribution(grid_size,0.0);\n"+
            offset(2)+"for (size_t i = 1; i < k; ++i)\n"+offset(2)+"{\n"+
            offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n"+
            offset(3)+"double dist_sum = 0.0;\n"+
	  offset(3)+"#pragma omp parallel for num_threads(32) private(min_dist,dist) shared(distribution) reduction(+:dist_sum)\n"+
            offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
            offset(4)+"for (size_t cluster = 0; cluster < i; ++cluster)\n"+
            offset(4)+"{\n"+
            offset(5)+"distance(dist, "+gridName+
            "[tup], means[cluster], cluster, &distance_to_mean[0]);\n"+
            offset(5)+"min_dist = std::min(dist, min_dist);\n"+
            offset(4)+"}\n"+
            offset(4)+"min_dist *= "+gridName+"[tup].aggregates[0];\n"+
            offset(4)+"distribution[tup] = min_dist;\n"+
            offset(4)+"dist_sum += min_dist;\n"+
            offset(3)+"}\n"+
            offset(3)+"distribution[0] /= dist_sum;\n"+
            offset(3)+"for (size_t tup = 1; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"distribution[tup] /= dist_sum;\n"+
            offset(4)+"distribution[tup] += distribution[tup-1];\n"+
            offset(3)+"}\n\n"+
            offset(3)+"// Sample a point...\n"+
            offset(3)+"const double sampleValue = ((double) rand() / (RAND_MAX));\n"+
            offset(3)+"size_t pos = 0;\n"+
            offset(3)+"while (distribution[pos] < sampleValue)\n"+
            offset(4)+"pos++;\n"+
            offset(3)+"means[i] = "+gridName+"[pos];\n"+
            offset(2)+"}\n"+
	  offset(2)+"int64_t endInit = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count()-startProcess;\n"+
	  offset(2)+"startProcess = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();\n";
    }
    else
    {
        /* String and associated stream to receive lines from the file. */
        string line;
        stringstream ssLine;

        while (std::getline(input, line))
        {
            if (line[0] == COMMENT_CHAR)
            {
                continue;
            }
            initList.push_back(line+"\n");
        }
    }

    std::string returnString = offset(2)+"// Initialize the means\n";
    
    for (size_t str = 0; str < std::min(initList.size(), _k); ++str)
    {
        returnString += offset(2)+"means["+std::to_string(str)+"] = "+
            initList[str];
    }
    
    if (initList.size() < _k)
    {
        returnString += offset(2)+"for (size_t cluster = "+
            std::to_string(initList.size())+"; cluster < k; ++cluster)\n"+
            offset(3)+"means[cluster] += "+gridName+"[rand() % "+
            gridName+".size()];\n\n";
    }
    
    return returnString;
}